

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimvcd.cpp
# Opt level: O0

ModuleTreeNode * __thiscall
BtorSimVCDWriter::sort_names(BtorSimVCDWriter *this,Btor2Parser *model,string *topname)

{
  char *pcVar1;
  bool bVar2;
  ModuleTreeNode *pMVar3;
  long lVar4;
  string *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  Btor2Line *le;
  Btor2Sort *sort_1;
  Btor2Line *l_1;
  int64_t id;
  pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  i_1;
  iterator __end1_1;
  iterator __begin1_1;
  map<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1_1;
  Btor2Sort *sort;
  Btor2Line *l;
  pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  i;
  iterator __end1;
  iterator __begin1;
  map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  ModuleTreeNode *top;
  pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe08;
  ModuleTreeNode *in_stack_fffffffffffffe10;
  pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe18;
  Btor2Line *in_stack_fffffffffffffe20;
  allocator local_169;
  string local_168 [32];
  undefined8 local_148;
  Btor2Sort *local_140;
  long local_138;
  pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_130;
  pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_128;
  _Self local_e0;
  _Self local_d8;
  long local_d0;
  allocator local_c1;
  string local_c0 [11];
  undefined1 in_stack_ffffffffffffff4b;
  uint32_t in_stack_ffffffffffffff4c;
  string *in_stack_ffffffffffffff50;
  int64_t in_stack_ffffffffffffff58;
  ModuleTreeNode *in_stack_ffffffffffffff60;
  undefined8 local_90;
  _Self local_68;
  _Self local_60;
  long local_58;
  undefined1 local_4d;
  string local_40 [32];
  ModuleTreeNode *local_20;
  undefined8 local_10;
  
  local_10 = in_RSI;
  pMVar3 = (ModuleTreeNode *)operator_new(0x68);
  local_4d = 1;
  std::__cxx11::string::string(local_40,in_RDX);
  ModuleTreeNode::ModuleTreeNode(in_stack_fffffffffffffe10,(string *)in_stack_fffffffffffffe08);
  local_4d = 0;
  std::__cxx11::string::~string(local_40);
  local_58 = in_RDI + 0x218;
  local_20 = pMVar3;
  local_60._M_node =
       (_Base_ptr)
       std::
       map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::begin((map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffffe08);
  local_68._M_node =
       (_Base_ptr)
       std::
       map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end((map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffffe08);
  while( true ) {
    bVar2 = std::operator!=(&local_60,&local_68);
    if (!bVar2) break;
    std::
    _Rb_tree_iterator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator*((_Rb_tree_iterator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x124693);
    std::
    pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair((pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    lVar4 = btor2parser_get_line_by_id(local_10,local_90);
    in_stack_ffffffffffffff60 =
         (ModuleTreeNode *)
         get_sort(in_stack_fffffffffffffe20,(Btor2Parser *)in_stack_fffffffffffffe18);
    pcVar1 = *(char **)(lVar4 + 0x60);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,pcVar1,&local_c1);
    ModuleTreeNode::sort_name
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
               in_stack_ffffffffffffff4c,(bool)in_stack_ffffffffffffff4b);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    std::
    pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x1247a4);
    std::
    _Rb_tree_iterator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffe10);
  }
  local_d0 = in_RDI + 0x248;
  local_d8._M_node =
       (_Base_ptr)
       std::
       map<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::begin((map<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffffe08);
  local_e0._M_node =
       (_Base_ptr)
       std::
       map<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end((map<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffffe08);
  while( true ) {
    bVar2 = std::operator!=(&local_d8,&local_e0);
    if (!bVar2) break;
    std::
    _Rb_tree_iterator<std::pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator*((_Rb_tree_iterator<std::pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x1248df);
    std::
    pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair((pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    local_130 = local_128;
    local_138 = btor2parser_get_line_by_id(local_10,local_128);
    local_140 = get_sort(in_stack_fffffffffffffe20,(Btor2Parser *)in_stack_fffffffffffffe18);
    local_148 = btor2parser_get_line_by_id(local_10,(local_140->field_3).array.element);
    in_stack_fffffffffffffe20 = *(Btor2Line **)(local_138 + 0x60);
    pMVar3 = local_20;
    in_stack_fffffffffffffe18 = local_130;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_168,(char *)in_stack_fffffffffffffe20,&local_169);
    ModuleTreeNode::sort_name
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
               in_stack_ffffffffffffff4c,(bool)in_stack_ffffffffffffff4b);
    std::__cxx11::string::~string(local_168);
    std::allocator<char>::~allocator((allocator<char> *)&local_169);
    std::
    pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)pMVar3);
    std::
    _Rb_tree_iterator<std::pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)pMVar3);
  }
  return local_20;
}

Assistant:

ModuleTreeNode*
BtorSimVCDWriter::sort_names (Btor2Parser* model, std::string topname)
{
  ModuleTreeNode* top = new ModuleTreeNode (topname);
  for (auto i : bv_identifiers)
  {
    Btor2Line* l = btor2parser_get_line_by_id (model, i.first);
    assert (l);
    assert (l->symbol);
    Btor2Sort* sort = get_sort (l, model);
    assert (sort->tag == BTOR2_TAG_SORT_bitvec);
    top->sort_name (
        i.first, std::string (l->symbol), sort->bitvec.width, symbol_fmt);
  }
  for (auto i : am_identifiers)
  {
    int64_t id   = i.first.first;
    Btor2Line* l = btor2parser_get_line_by_id (model, id);
    assert (l);
    assert (l->symbol);
    Btor2Sort* sort = get_sort (l, model);
    assert (sort->tag == BTOR2_TAG_SORT_array);
    Btor2Line* le = btor2parser_get_line_by_id (model, sort->array.element);
    top->sort_name (
        id, std::string (l->symbol), le->sort.bitvec.width, symbol_fmt);
  }
  return top;
}